

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * __thiscall
fmt::v6::internal::float_writer<wchar_t>::prettify<wchar_t*>
          (float_writer<wchar_t> *this,wchar_t *it)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  wchar_t *pwVar8;
  wchar_t *pwVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  long lVar19;
  long lVar20;
  int iVar25;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar31 [16];
  
  uVar11 = this->num_digits_;
  uVar13 = (ulong)uVar11;
  uVar7 = this->exp_;
  uVar16 = (ulong)uVar7;
  uVar10 = uVar7 + uVar11;
  if ((this->specs_).field_0x4 == '\x01') {
    pcVar15 = this->digits_;
    *it = (int)*pcVar15;
    iVar25 = (this->specs_).precision;
    if (((int)uVar11 < 2) && (((this->specs_).field_0x6 & 0x20) == 0)) {
      pwVar8 = it + 1;
    }
    else {
      it[1] = this->decimal_point_;
      pwVar8 = it + 2;
    }
    uVar7 = iVar25 - uVar11;
    if (1 < (int)uVar11) {
      lVar12 = uVar13 + 1;
      do {
        pcVar15 = pcVar15 + 1;
        *pwVar8 = (int)*pcVar15;
        pwVar8 = pwVar8 + 1;
        lVar12 = lVar12 + -1;
      } while (2 < lVar12);
    }
    auVar6 = _DAT_00187920;
    auVar5 = _DAT_00187910;
    auVar4 = _DAT_00187410;
    pwVar9 = pwVar8;
    if ((0 < (int)uVar7) && (((this->specs_).field_0x6 & 0x20) != 0)) {
      pwVar9 = pwVar8 + uVar7;
      uVar13 = (ulong)uVar7 + 0x3fffffffffffffff;
      uVar16 = uVar13 & 0x3fffffffffffffff;
      auVar23._8_4_ = (int)uVar16;
      auVar23._0_8_ = uVar16;
      auVar23._12_4_ = (int)(uVar16 >> 0x20);
      lVar12 = 0;
      auVar23 = auVar23 ^ _DAT_00187410;
      do {
        auVar28._8_4_ = (int)lVar12;
        auVar28._0_8_ = lVar12;
        auVar28._12_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar31 = (auVar28 | auVar6) ^ auVar4;
        iVar25 = auVar23._4_4_;
        if ((bool)(~(auVar31._4_4_ == iVar25 && auVar23._0_4_ < auVar31._0_4_ ||
                    iVar25 < auVar31._4_4_) & 1)) {
          pwVar8[lVar12] = L'0';
        }
        if ((auVar31._12_4_ != auVar23._12_4_ || auVar31._8_4_ <= auVar23._8_4_) &&
            auVar31._12_4_ <= auVar23._12_4_) {
          pwVar8[lVar12 + 1] = L'0';
        }
        auVar28 = (auVar28 | auVar5) ^ auVar4;
        iVar32 = auVar28._4_4_;
        if (iVar32 <= iVar25 && (iVar32 != iVar25 || auVar28._0_4_ <= auVar23._0_4_)) {
          pwVar8[lVar12 + 2] = L'0';
          pwVar8[lVar12 + 3] = L'0';
        }
        lVar12 = lVar12 + 4;
      } while ((uVar16 - ((uint)uVar13 & 3)) + 4 != lVar12);
    }
    *pwVar9 = (uint)((*(uint *)&(this->specs_).field_0x4 >> 0x10 & 1) == 0) << 5 | 0x45;
    pwVar8 = write_exponent<wchar_t,wchar_t*>(uVar10 - 1,pwVar9 + 1);
    return pwVar8;
  }
  if ((int)uVar7 < 0) {
    if ((int)uVar10 < 1) {
      *it = L'0';
      uVar7 = -uVar10;
      if (uVar11 == 0) {
        uVar1 = (this->specs_).precision;
        uVar3 = uVar7;
        if (SBORROW4(uVar1,uVar7) != (int)(uVar1 + uVar10) < 0) {
          uVar3 = uVar1;
        }
        if (-1 < (int)uVar1) {
          uVar7 = uVar3;
        }
      }
      uVar10 = *(uint *)&(this->specs_).field_0x4 & 0x200000;
      if (0 < (int)uVar11 && (char)(uVar10 >> 0x15) == '\0') {
        do {
          if (this->digits_[uVar13 - 1] != '0') goto LAB_00183d06;
          bVar2 = 1 < (long)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar2);
        uVar13 = 0;
      }
LAB_00183d06:
      if ((uVar10 == 0 && uVar7 == 0) && (int)uVar13 == 0) {
        pwVar9 = it + 1;
      }
      else {
        pwVar9 = it + 2;
        it[1] = this->decimal_point_;
        auVar6 = _DAT_00187920;
        auVar5 = _DAT_00187910;
        auVar4 = _DAT_00187410;
        if (0 < (int)uVar7) {
          pwVar9 = pwVar9 + uVar7;
          uVar16 = (ulong)uVar7 + 0x3fffffffffffffff;
          uVar17 = uVar16 & 0x3fffffffffffffff;
          auVar24._8_4_ = (int)uVar17;
          auVar24._0_8_ = uVar17;
          auVar24._12_4_ = (int)(uVar17 >> 0x20);
          lVar12 = 0;
          auVar24 = auVar24 ^ _DAT_00187410;
          do {
            auVar29._8_4_ = (int)lVar12;
            auVar29._0_8_ = lVar12;
            auVar29._12_4_ = (int)((ulong)lVar12 >> 0x20);
            auVar23 = (auVar29 | auVar6) ^ auVar4;
            iVar25 = auVar24._4_4_;
            if ((bool)(~(auVar23._4_4_ == iVar25 && auVar24._0_4_ < auVar23._0_4_ ||
                        iVar25 < auVar23._4_4_) & 1)) {
              it[lVar12 + 2] = L'0';
            }
            if ((auVar23._12_4_ != auVar24._12_4_ || auVar23._8_4_ <= auVar24._8_4_) &&
                auVar23._12_4_ <= auVar24._12_4_) {
              it[lVar12 + 3] = L'0';
            }
            auVar23 = (auVar29 | auVar5) ^ auVar4;
            iVar32 = auVar23._4_4_;
            if (iVar32 <= iVar25 && (iVar32 != iVar25 || auVar23._0_4_ <= auVar24._0_4_)) {
              it[lVar12 + 4] = L'0';
              it[lVar12 + 5] = L'0';
            }
            lVar12 = lVar12 + 4;
          } while ((uVar17 - ((uint)uVar16 & 3)) + 4 != lVar12);
        }
        if (0 < (int)uVar13) {
          pcVar15 = this->digits_;
          lVar12 = (uVar13 & 0xffffffff) + 1;
          do {
            *pwVar9 = (int)*pcVar15;
            pcVar15 = pcVar15 + 1;
            pwVar9 = pwVar9 + 1;
            lVar12 = lVar12 + -1;
          } while (1 < lVar12);
        }
      }
    }
    else {
      lVar19 = (long)(int)uVar11;
      pcVar15 = this->digits_;
      uVar13 = (ulong)uVar10;
      lVar12 = uVar13 + 1;
      lVar20 = 0;
      lVar14 = 0;
      do {
        it[lVar20] = (int)pcVar15[lVar20];
        lVar12 = lVar12 + -1;
        lVar14 = lVar14 + -4;
        lVar20 = lVar20 + 1;
      } while (1 < lVar12);
      pcVar18 = pcVar15 + uVar13;
      if (((this->specs_).field_0x6 & 0x20) == 0) {
        lVar12 = -lVar14;
        uVar7 = uVar11 - 1;
        if ((int)uVar10 < (int)(uVar11 - 1)) {
          uVar7 = uVar10;
        }
        do {
          if (pcVar15[lVar19 + -1] != '0') {
            uVar7 = (uint)lVar19;
            break;
          }
          lVar19 = lVar19 + -1;
        } while ((long)uVar13 < lVar19);
        if (uVar7 != uVar10) {
          lVar12 = 4 - lVar14;
          it[lVar20] = this->decimal_point_;
        }
        pwVar9 = (wchar_t *)((long)it + lVar12);
        lVar12 = (long)(int)uVar7 - uVar13;
        if (lVar12 != 0 && (long)uVar13 <= (long)(int)uVar7) {
          lVar12 = lVar12 + 1;
          do {
            *pwVar9 = (int)*pcVar18;
            pcVar18 = pcVar18 + 1;
            pwVar9 = pwVar9 + 1;
            lVar12 = lVar12 + -1;
          } while (1 < lVar12);
        }
      }
      else {
        pwVar8 = (wchar_t *)((long)it + (4 - lVar14));
        it[lVar20] = this->decimal_point_;
        if (lVar19 - uVar13 != 0 && (long)uVar13 <= lVar19) {
          lVar12 = (lVar19 - uVar13) + 1;
          do {
            *pwVar8 = (int)*pcVar18;
            pcVar18 = pcVar18 + 1;
            pwVar8 = pwVar8 + 1;
            lVar12 = lVar12 + -1;
          } while (1 < lVar12);
        }
        auVar6 = _DAT_00187920;
        auVar5 = _DAT_00187910;
        auVar4 = _DAT_00187410;
        iVar25 = (this->specs_).precision;
        uVar7 = iVar25 - uVar11;
        pwVar9 = pwVar8;
        if ((uVar7 != 0 && (int)uVar11 <= iVar25) && (uVar7 != 0 && (int)uVar11 <= iVar25)) {
          uVar13 = (ulong)uVar7 + 0x3fffffffffffffff;
          uVar16 = uVar13 & 0x3fffffffffffffff;
          auVar31._8_4_ = (int)uVar16;
          auVar31._0_8_ = uVar16;
          auVar31._12_4_ = (int)(uVar16 >> 0x20);
          lVar12 = 0;
          auVar31 = auVar31 ^ _DAT_00187410;
          do {
            auVar30._8_4_ = (int)lVar12;
            auVar30._0_8_ = lVar12;
            auVar30._12_4_ = (int)((ulong)lVar12 >> 0x20);
            auVar23 = (auVar30 | auVar6) ^ auVar4;
            iVar25 = auVar31._4_4_;
            if ((bool)(~(auVar23._4_4_ == iVar25 && auVar31._0_4_ < auVar23._0_4_ ||
                        iVar25 < auVar23._4_4_) & 1)) {
              pwVar8[lVar12] = L'0';
            }
            if ((auVar23._12_4_ != auVar31._12_4_ || auVar23._8_4_ <= auVar31._8_4_) &&
                auVar23._12_4_ <= auVar31._12_4_) {
              pwVar8[lVar12 + 1] = L'0';
            }
            auVar23 = (auVar30 | auVar5) ^ auVar4;
            iVar32 = auVar23._4_4_;
            if (iVar32 <= iVar25 && (iVar32 != iVar25 || auVar23._0_4_ <= auVar31._0_4_)) {
              pwVar8[lVar12 + 2] = L'0';
              pwVar8[lVar12 + 3] = L'0';
            }
            lVar12 = lVar12 + 4;
            pwVar9 = pwVar8 + uVar7;
          } while ((uVar16 - ((uint)uVar13 & 3)) + 4 != lVar12);
        }
      }
    }
  }
  else {
    if (0 < (int)uVar11) {
      pcVar15 = this->digits_;
      lVar12 = uVar13 + 1;
      do {
        *it = (int)*pcVar15;
        pcVar15 = pcVar15 + 1;
        it = it + 1;
        lVar12 = lVar12 + -1;
      } while (1 < lVar12);
    }
    auVar6 = _DAT_00187920;
    auVar5 = _DAT_00187910;
    auVar4 = _DAT_00187410;
    pwVar8 = it;
    if (uVar16 != 0) {
      pwVar8 = it + uVar16;
      uVar13 = uVar16 + 0x3fffffffffffffff & 0x3fffffffffffffff;
      auVar21._8_4_ = (int)uVar13;
      auVar21._0_8_ = uVar13;
      auVar21._12_4_ = (int)(uVar13 >> 0x20);
      lVar12 = 0;
      auVar21 = auVar21 ^ _DAT_00187410;
      do {
        auVar26._8_4_ = (int)lVar12;
        auVar26._0_8_ = lVar12;
        auVar26._12_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar23 = (auVar26 | auVar6) ^ auVar4;
        iVar25 = auVar21._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar25 && auVar21._0_4_ < auVar23._0_4_ ||
                    iVar25 < auVar23._4_4_) & 1)) {
          it[lVar12] = L'0';
        }
        if ((auVar23._12_4_ != auVar21._12_4_ || auVar23._8_4_ <= auVar21._8_4_) &&
            auVar23._12_4_ <= auVar21._12_4_) {
          it[lVar12 + 1] = L'0';
        }
        auVar23 = (auVar26 | auVar5) ^ auVar4;
        iVar32 = auVar23._4_4_;
        if (iVar32 <= iVar25 && (iVar32 != iVar25 || auVar23._0_4_ <= auVar21._0_4_)) {
          it[lVar12 + 2] = L'0';
          it[lVar12 + 3] = L'0';
        }
        lVar12 = lVar12 + 4;
      } while ((uVar13 - ((uint)(uVar16 + 0x3fffffffffffffff) & 3)) + 4 != lVar12);
    }
    iVar25 = (this->specs_).precision;
    pwVar9 = pwVar8;
    if ((byte)(iVar25 < 0 | ((this->specs_).field_0x6 & 0x20) >> 5) == 1) {
      *pwVar8 = this->decimal_point_;
      auVar6 = _DAT_00187920;
      auVar5 = _DAT_00187910;
      auVar4 = _DAT_00187410;
      uVar11 = iVar25 - uVar10;
      if (uVar11 == 0 || iVar25 < (int)uVar10) {
        pwVar9 = pwVar8 + 1;
        if ((this->specs_).field_0x4 != '\x02') {
          pwVar8[1] = L'0';
          pwVar9 = pwVar8 + 2;
        }
      }
      else {
        uVar13 = (ulong)uVar11 + 0x3fffffffffffffff;
        uVar16 = uVar13 & 0x3fffffffffffffff;
        auVar22._8_4_ = (int)uVar16;
        auVar22._0_8_ = uVar16;
        auVar22._12_4_ = (int)(uVar16 >> 0x20);
        lVar12 = 0;
        auVar22 = auVar22 ^ _DAT_00187410;
        do {
          auVar27._8_4_ = (int)lVar12;
          auVar27._0_8_ = lVar12;
          auVar27._12_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar23 = (auVar27 | auVar6) ^ auVar4;
          iVar25 = auVar22._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar25 && auVar22._0_4_ < auVar23._0_4_ ||
                      iVar25 < auVar23._4_4_) & 1)) {
            pwVar8[lVar12 + 1] = L'0';
          }
          if ((auVar23._12_4_ != auVar22._12_4_ || auVar23._8_4_ <= auVar22._8_4_) &&
              auVar23._12_4_ <= auVar22._12_4_) {
            pwVar8[lVar12 + 2] = L'0';
          }
          auVar23 = (auVar27 | auVar5) ^ auVar4;
          iVar32 = auVar23._4_4_;
          if (iVar32 <= iVar25 && (iVar32 != iVar25 || auVar23._0_4_ <= auVar22._0_4_)) {
            pwVar8[lVar12 + 3] = L'0';
            pwVar8[lVar12 + 4] = L'0';
          }
          lVar12 = lVar12 + 4;
          pwVar9 = pwVar8 + 1 + uVar11;
        } while ((uVar16 - ((uint)uVar13 & 3)) + 4 != lVar12);
      }
    }
  }
  return pwVar9;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }